

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _listNode.hpp
# Opt level: O0

void __thiscall
ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
listNode(listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *other)

{
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other_local;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this);
  operator=(this,other);
  return;
}

Assistant:

listNode(listNode const & other): data() {
		*this = other;
	}